

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Scene * red_blue(void)

{
  Point3 look_from;
  Point3 look_at;
  Vec3 vup;
  double aperture_00;
  Scene *in_RDI;
  double focus_dist;
  Vec3 local_268;
  Vec3 local_250;
  double local_238;
  double dStack_230;
  double local_228;
  double local_218;
  double dStack_210;
  double local_208;
  undefined1 local_1f8 [8];
  Camera camera;
  double aperture;
  double field_of_view;
  Point3 camera_target;
  Point3 camera_position;
  undefined1 local_f0 [40];
  undefined1 local_c8 [32];
  Vec3 local_a8;
  Vec3 local_90;
  Vec3 local_70;
  undefined1 local_58 [32];
  undefined1 local_38 [8];
  double r;
  ObjectList objects;
  
  ObjectList::ObjectList((ObjectList *)&r);
  local_38 = (undefined1  [8])cos(0.7853981633974483);
  Vec3::Vec3(&local_70,-(double)local_38,0.0,-1.0);
  Vec3::Vec3(&local_a8,0.0,0.0,1.0);
  std::make_shared<Lambertian,Vec3>(&local_90);
  std::make_shared<Sphere,Vec3,double&,std::shared_ptr<Lambertian>>
            ((Vec3 *)local_58,local_70.e,(shared_ptr<Lambertian> *)local_38);
  std::shared_ptr<Object>::shared_ptr<Sphere,void>
            ((shared_ptr<Object> *)(local_58 + 0x10),(shared_ptr<Sphere> *)local_58);
  ObjectList::add((ObjectList *)&r,(shared_ptr<Object> *)(local_58 + 0x10));
  std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)(local_58 + 0x10));
  std::shared_ptr<Sphere>::~shared_ptr((shared_ptr<Sphere> *)local_58);
  std::shared_ptr<Lambertian>::~shared_ptr((shared_ptr<Lambertian> *)&local_90);
  Vec3::Vec3((Vec3 *)(local_f0 + 0x10),(double)local_38,0.0,-1.0);
  Vec3::Vec3((Vec3 *)(camera_position.e + 2),1.0,0.0,0.0);
  std::make_shared<Lambertian,Vec3>((Vec3 *)local_f0);
  std::make_shared<Sphere,Vec3,double&,std::shared_ptr<Lambertian>>
            ((Vec3 *)local_c8,(double *)(local_f0 + 0x10),(shared_ptr<Lambertian> *)local_38);
  std::shared_ptr<Object>::shared_ptr<Sphere,void>
            ((shared_ptr<Object> *)(local_c8 + 0x10),(shared_ptr<Sphere> *)local_c8);
  ObjectList::add((ObjectList *)&r,(shared_ptr<Object> *)(local_c8 + 0x10));
  std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)(local_c8 + 0x10));
  std::shared_ptr<Sphere>::~shared_ptr((shared_ptr<Sphere> *)local_c8);
  std::shared_ptr<Lambertian>::~shared_ptr((shared_ptr<Lambertian> *)local_f0);
  Vec3::Vec3((Vec3 *)(camera_target.e + 2),0.0,0.0,0.0);
  Vec3::Vec3((Vec3 *)&field_of_view,0.0,0.0,-1.0);
  camera.lens_radius_ = 0.0;
  local_208 = camera_position.e[1];
  local_218 = camera_target.e[2];
  dStack_210 = camera_position.e[0];
  local_228 = camera_target.e[1];
  local_238 = field_of_view;
  dStack_230 = camera_target.e[0];
  Vec3::Vec3(&local_250,0.0,1.0,0.0);
  aperture_00 = camera.lens_radius_;
  operator-(&local_268,(Vec3 *)(camera_target.e + 2),(Vec3 *)&field_of_view);
  focus_dist = Vec3::length(&local_268);
  look_from.e[1] = dStack_210;
  look_from.e[0] = local_218;
  look_from.e[2] = local_208;
  look_at.e[1] = dStack_230;
  look_at.e[0] = local_238;
  look_at.e[2] = local_228;
  vup.e[1] = local_250.e[1];
  vup.e[0] = local_250.e[0];
  vup.e[2] = local_250.e[2];
  Camera::Camera((Camera *)local_1f8,look_from,look_at,vup,90.0,1.7777777777777777,aperture_00,
                 focus_dist);
  ObjectList::ObjectList(&in_RDI->objects_,(ObjectList *)&r);
  memcpy(&in_RDI->camera_,local_1f8,0xb0);
  ObjectList::~ObjectList((ObjectList *)&r);
  return in_RDI;
}

Assistant:

Scene red_blue() {
  ObjectList objects;

  double r = cos(PI/4);
  objects.add(std::make_shared<Sphere>(Point3(-r, 0, -1),
            r,
            std::make_shared<Lambertian>(Color(0,0,1))));
  objects.add(std::make_shared<Sphere>(Point3(r, 0, -1),
            r,
            std::make_shared<Lambertian>(Color(1, 0, 0))));

  // Setup camera
  Point3 camera_position{0, 0, 0};
  Point3 camera_target{0, 0, -1};
  double field_of_view = 90;
  double aperture = 0.0; // no defocus blur

  Camera camera(camera_position,
                camera_target,
                Point3(0, 1, 0),
                field_of_view,
                ASPECT_RATIO,
                aperture,
                (camera_position - camera_target).length());

  return {objects, camera};
}